

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmpfile_s.c
# Opt level: O3

int main(void)

{
  errno_t eVar1;
  int iVar2;
  FILE *pFVar3;
  FILE *fh;
  char filename [46];
  FILE *local_40;
  char local_38 [48];
  
  set_constraint_handler_s(test_handler);
  eVar1 = tmpfile_s((FILE **)&local_40);
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/tmpfile_s.c, line %d - %s\n"
           ,0x3c,"( tmpfile_s( &fh ) ) == 0");
  }
  iVar2 = fputc(0x78,local_40);
  if (iVar2 != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/tmpfile_s.c, line %d - %s\n"
           ,0x3d,"fputc( \'x\', fh ) == \'x\'");
  }
  strcpy(local_38,*(char **)&local_40->_fileno);
  pFVar3 = fopen(local_38,"r");
  if (pFVar3 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/tmpfile_s.c, line %d - %s\n"
           ,0x40,"( fhtest = fopen( filename, \"r\" ) ) != ((void *)0)");
  }
  iVar2 = fclose(pFVar3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/tmpfile_s.c, line %d - %s\n"
           ,0x41,"fclose( fhtest ) == 0");
  }
  iVar2 = fclose(local_40);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/tmpfile_s.c, line %d - %s\n"
           ,0x43,"fclose( fh ) == 0");
  }
  pFVar3 = fopen(local_38,"r");
  if (pFVar3 != (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/tmpfile_s.c, line %d - %s\n"
           ,0x45,"fopen( filename, \"r\" ) == ((void *)0)");
  }
  (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
  if (HANDLER_CALLS != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/tmpfile_s.c, line %d - %s\n"
           ,0x4a,"HANDLER_CALLS == 1");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    FILE * fh;
    char filename[ L_tmpnam ];
    FILE * fhtest;
    set_constraint_handler_s( test_handler );

    TESTCASE( ( tmpfile_s( &fh ) ) == 0 );
    TESTCASE( fputc( 'x', fh ) == 'x' );
    /* Checking that file is actually there */
    TESTCASE_NOREG( strcpy( filename, fh->filename ) == filename );
    TESTCASE_NOREG( ( fhtest = fopen( filename, "r" ) ) != NULL );
    TESTCASE_NOREG( fclose( fhtest ) == 0 );
    /* Closing tmpfile */
    TESTCASE( fclose( fh ) == 0 );
    /* Checking that file was deleted */
    TESTCASE_NOREG( fopen( filename, "r" ) == NULL );

    /* Constraint violation */
    TESTCASE( ( tmpfile_s( NULL ) ) != 0 );

    TESTCASE( HANDLER_CALLS == 1 );
#endif
    return TEST_RESULTS;
}